

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk * gauntlet_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  ushort uVar2;
  undefined2 uVar3;
  wchar_t wVar4;
  _Bool _Var5;
  int16_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  chunk *c;
  chunk *c_00;
  chunk *c_01;
  loc lVar13;
  loc_conflict lVar14;
  loc lVar15;
  char *pcVar16;
  chunk *pcVar17;
  wchar_t h;
  wchar_t x0;
  uint uVar18;
  int iVar19;
  int iVar20;
  wchar_t wVar21;
  
  uVar7 = Rand_div(5);
  uVar8 = Rand_div(10);
  uVar1 = z_info->dungeon_hgt;
  uVar9 = Rand_div(uVar7 * -2 + 0x14);
  uVar2 = z_info->dungeon_wid;
  uVar10 = Rand_div(uVar8 * -2 + 0x18);
  if (dun->persist == true) {
    *p_error = "no gauntlet levels in persistent dungeons";
    return (chunk *)0x0;
  }
  c = labyrinth_chunk(p,uVar7 * 2 + L'\x05',uVar8 * 2 + L'\x15',false,false);
  if (c == (chunk *)0x0) {
    pcVar16 = "labyrinth chunk could not be generated";
  }
  else {
    h = uVar1 - uVar9;
    wVar21 = (int)((uint)uVar2 + uVar8 * -2 + -0x17) / 2 - uVar10;
    c_00 = cavern_chunk(p,h,wVar21,(connector *)0x0);
    if (c_00 == (chunk *)0x0) {
      uncreate_artifacts((chunk_conflict *)c);
      cave_free((chunk_conflict *)c);
      pcVar16 = "left cavern chunk could not be generated";
    }
    else {
      c_01 = cavern_chunk(p,h,wVar21,(connector *)0x0);
      if (c_01 == (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c);
        cave_free((chunk_conflict *)c);
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
        pcVar16 = "right cavern chunk could not be generated";
      }
      else {
        wVar21 = c_00->width;
        x0 = c->width + wVar21;
        generate_mark(c_00,L'\0',L'\0',c_00->height + L'\xffffffff',wVar21 + L'\xffffffff',L'\x0f');
        generate_mark(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x10');
        generate_mark(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x0f');
        wVar12 = FEAT_MORE;
        wVar11 = rand_range(2,3);
        alloc_stairs((chunk_conflict *)c_01,wVar12,wVar11,L'\0',false,(connector *)0x0);
        wVar12 = FEAT_LESS;
        wVar11 = rand_range(1,3);
        alloc_stairs((chunk_conflict *)c_00,wVar12,wVar11,L'\0',false,(connector *)0x0);
        uVar18 = 0xffffffff;
        do {
          uVar7 = Rand_div(c->height + L'\xfffffffe');
          lVar13 = (loc)loc(0,uVar7 + 1);
          uVar18 = uVar18 + 1;
          if (0x13 < uVar18) goto LAB_0014b25a;
          lVar14 = loc(1,0);
          lVar15 = (loc)loc_sum((loc_conflict)lVar13,lVar14);
          _Var5 = square_isperm((chunk_conflict *)c,lVar15);
        } while (_Var5);
        square_set_feat((chunk_conflict *)c,lVar13,FEAT_GRANITE);
        iVar19 = 0x15;
        do {
          wVar12 = c->width;
          uVar7 = Rand_div(c->height + L'\xfffffffe');
          lVar13 = (loc)loc(wVar12 + L'\xffffffff',uVar7 + 1);
          iVar19 = iVar19 + -1;
          if (iVar19 == 0) goto LAB_0014b25a;
          lVar14 = loc(-1,0);
          lVar15 = (loc)loc_sum((loc_conflict)lVar13,lVar14);
          _Var5 = square_isperm((chunk_conflict *)c,lVar15);
        } while (_Var5);
        square_set_feat((chunk_conflict *)c,lVar13,FEAT_GRANITE);
        uVar3 = p->depth;
        if ((ushort)(uVar3 - 0x21) < 0xffe5) {
          uVar7 = (uint)(5 < (short)uVar3) * 4 + 1;
        }
        else {
          uVar7 = (uint32_t)(byte)((uVar3 & 0xff) / 6);
        }
        pcVar17 = c_00;
        if (p->upkeep->create_stair == FEAT_MORE) {
          pcVar17 = c_01;
        }
        _Var5 = new_player_spot((chunk_conflict *)pcVar17,p);
        if (_Var5) {
          wVar11 = x0;
          wVar12 = L'\0';
          if (pcVar17 == c_01) {
            wVar11 = L'\0';
            wVar12 = x0;
          }
          iVar19 = (p->grid).x;
          wVar4 = (p->grid).y;
          lVar13.x = wVar12 + iVar19;
          uVar1 = z_info->level_monster_min;
          uVar8 = Rand_div(4);
          lVar13.y = wVar4;
          for (iVar20 = uVar7 + uVar8 + 1 + (uint)uVar1; 0 < iVar20; iVar20 = iVar20 + -1) {
            pick_and_place_distant_monster(c_00,lVar13,L'\0',true,c_00->depth);
          }
          uVar1 = z_info->level_monster_min;
          uVar8 = Rand_div(4);
          lVar15.y = wVar4;
          lVar15.x = iVar19 - wVar11;
          for (iVar19 = uVar8 + uVar7 + 1 + (uint)uVar1; 0 < iVar19; iVar19 = iVar19 + -1) {
            pick_and_place_distant_monster(c_01,lVar15,L'\0',true,c_01->depth);
          }
          uVar1 = z_info->level_monster_min;
          uVar8 = Rand_div(6);
          do {
            set_pit_type(c->depth,L'\0');
            _Var5 = mon_restrict(dun->pit_type->name,c->depth,c->depth,true);
          } while (!_Var5);
          if ((player->opts).opt[0x18] == true) {
            msg("Gauntlet - %s",dun->pit_type->name);
          }
          wVar11 = c->height / 2;
          wVar12 = c->width / 2;
          spread_monsters(c,dun->pit_type->name,c->depth,uVar7 + 1 + uVar8 + (uint)uVar1,wVar11,
                          wVar12,wVar11,wVar12,'\x06');
          mon_restrict((char *)0x0,c->depth,c->depth,false);
          pcVar17 = (chunk *)cave_new(h,c->width + c_00->width + c_01->width);
          pcVar17->depth = (int)p->depth;
          pcVar17->place = (int)p->place;
          fill_rectangle(pcVar17,L'\0',L'\0',pcVar17->height + L'\xffffffff',
                         pcVar17->width + L'\xffffffff',FEAT_GRANITE,L'\0');
          fill_rectangle(pcVar17,L'\0',wVar21,pcVar17->height + L'\xffffffff',x0 + L'\xffffffff',
                         FEAT_PERM,L'\0');
          chunk_copy((chunk_conflict *)pcVar17,p,(chunk_conflict *)c_00,L'\0',L'\0',L'\0',false);
          chunk_copy((chunk_conflict *)pcVar17,p,(chunk_conflict *)c,(h - c->height) / 2,wVar21,
                     L'\0',false);
          chunk_copy((chunk_conflict *)pcVar17,p,(chunk_conflict *)c_01,L'\0',x0,L'\0',false);
          cave_free((chunk_conflict *)c_00);
          cave_free((chunk_conflict *)c);
          cave_free((chunk_conflict *)c_01);
          draw_rectangle(pcVar17,L'\0',L'\0',pcVar17->height + L'\xffffffff',
                         pcVar17->width + L'\xffffffff',FEAT_PERM,L'\0',true);
          ensure_connectedness(pcVar17,true);
          uVar8 = Rand_div(uVar7);
          alloc_objects((chunk_conflict *)pcVar17,L'\x01',L'\0',uVar8 + L'\x01',pcVar17->depth,'\0')
          ;
          uVar7 = Rand_div(uVar7);
          alloc_objects((chunk_conflict *)pcVar17,L'\x01',L'\x01',uVar7 + L'\x01',pcVar17->depth,
                        '\0');
          iVar6 = Rand_normal((uint)z_info->room_item_av,3);
          alloc_objects((chunk_conflict *)pcVar17,L'\x02',L'\x03',(int)iVar6,pcVar17->depth,'\x01');
          iVar6 = Rand_normal((uint)z_info->both_item_av,3);
          alloc_objects((chunk_conflict *)pcVar17,L'\x03',L'\x03',(int)iVar6,pcVar17->depth,'\x01');
          iVar6 = Rand_normal((uint)z_info->both_gold_av,3);
          alloc_objects((chunk_conflict *)pcVar17,L'\x03',L'\x02',(int)iVar6,pcVar17->depth,'\x01');
          return pcVar17;
        }
        uncreate_artifacts((chunk_conflict *)c);
        cave_free((chunk_conflict *)c);
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
        uncreate_artifacts((chunk_conflict *)c_01);
        cave_free((chunk_conflict *)c_01);
        pcVar16 = "could not place player";
      }
    }
  }
LAB_0014b2bf:
  *p_error = pcVar16;
  return (chunk *)0x0;
LAB_0014b25a:
  uncreate_artifacts((chunk_conflict *)c);
  cave_free((chunk_conflict *)c);
  uncreate_artifacts((chunk_conflict *)c_00);
  cave_free((chunk_conflict *)c_00);
  uncreate_artifacts((chunk_conflict *)c_01);
  cave_free((chunk_conflict *)c_01);
  pcVar16 = "could not open entrance to the labyrinth";
  goto LAB_0014b2bf;
}

Assistant:

struct chunk *gauntlet_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	struct chunk *c;
	struct chunk *left;
	struct chunk *gauntlet;
	struct chunk *right;
	struct chunk *arrival;
	int gauntlet_hgt = 2 * randint1(5) + 3;
	int gauntlet_wid = 2 * randint1(10) + 19;
	int y_size = z_info->dungeon_hgt - randint0(25 - gauntlet_hgt);
	/*
	 * labyrinth_gen() generates something that's two grids wider than
	 * the argument passed, thus the extra "- 2" below.
	 */
	int x_size = (z_info->dungeon_wid - gauntlet_wid - 2) / 2 -
		randint0(45 - gauntlet_wid);
	struct loc p_loc_in_r, p_loc_in_l;
	int line1, line2;

	/* No persistent levels of this type for now */
	if (dun->persist) {
		*p_error = "no gauntlet levels in persistent dungeons";
		return NULL;
	}

	gauntlet = labyrinth_chunk(p, gauntlet_hgt, gauntlet_wid, false, false);
	if (!gauntlet) {
		*p_error = "labyrinth chunk could not be generated";
		return NULL;
	}

	left = cavern_chunk(p, y_size, x_size, NULL);
	if (!left) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		*p_error = "left cavern chunk could not be generated";
		return NULL;
	}

	right = cavern_chunk(p, y_size, x_size, NULL);
	if (!right) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		*p_error = "right cavern chunk could not be generated";
		return NULL;
	}

	/* Record lines between chunks */
	line1 = left->width;
	line2 = line1 + gauntlet->width;

	/* Set the movement and mapping restrictions */
	generate_mark(left, 0, 0, left->height - 1, left->width - 1,
		SQUARE_NO_TELEPORT);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_MAP);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_TELEPORT);

	/* Place down stairs in the right cavern */
	alloc_stairs(right, FEAT_MORE, rand_range(2, 3), 0, false, NULL);

	/* Place up stairs in the left cavern */
	alloc_stairs(left, FEAT_LESS, rand_range(1, 3), 0, false, NULL);

	/*
	 * Open the ends of the gauntlet.  Make sure the opening is
	 * horizontally adjacent to a non-permanent wall for interoperability
	 * with ensure_connectedness().
	 */
	i = 0;
	while (1) {
		struct loc grid = loc(0, randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}
	i = 0;
	while (1) {
		struct loc grid = loc(gauntlet->width - 1,
			randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(-1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the arrival cavern */
	arrival = (p->upkeep->create_stair == FEAT_MORE) ? right : left;
	if (!new_player_spot(arrival, p)) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		uncreate_artifacts(right);
		cave_free(right);
		*p_error = "could not place player";
		return NULL;
	}
	/*
	 * Account for the player's location relative to the right and left
	 * chunks for use in pick_and_place_distant_monster().  The
	 * transformations here have to match what the calls to chunk_copy()
	 * below do.
	 */
	if (arrival == right) {
		p_loc_in_r = p->grid;
		p_loc_in_l.x = line2 + p->grid.x;
		p_loc_in_l.y = p->grid.y;
	} else {
		p_loc_in_l = p->grid;
		p_loc_in_r.x = p->grid.x - line2;
		p_loc_in_r.y = p->grid.y;
	}

	/* Pick some monsters for the left cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(left, p_loc_in_l, 0, true,
			left->depth);
	}

	/* Pick some of monsters for the right cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(right, p_loc_in_r, 0, true,
			right->depth);
	}

	/* Pick a larger number of monsters for the gauntlet */
	i = (z_info->level_monster_min + randint1(6) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(gauntlet->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, gauntlet->depth, gauntlet->depth, true))
			break;
	}

	ROOM_LOG("Gauntlet - %s", dun->pit_type->name);

	/* Place labyrinth monsters */
	spread_monsters(gauntlet, dun->pit_type->name, gauntlet->depth, i,
					gauntlet->height / 2, gauntlet->width / 2,
					gauntlet->height / 2, gauntlet->width / 2,
					ORIGIN_LABYRINTH);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, gauntlet->depth, gauntlet->depth, false);

	/* Make the level */
	c = cave_new(y_size, left->width + gauntlet->width + right->width);
	c->depth = p->depth;
	c->place = p->place;

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_GRANITE, SQUARE_NONE);

	/* Fill the area between the caverns with permanent rock */
	fill_rectangle(c, 0, line1, c->height - 1, line2 - 1, FEAT_PERM,
		SQUARE_NONE);

	/* Copy in the pieces */
	chunk_copy(c, p, left, 0, 0, 0, false);
	chunk_copy(c, p, gauntlet, (y_size - gauntlet->height) / 2, line1, 0, false);
	chunk_copy(c, p, right, 0, line2, 0, false);

	/* Free the chunks */
	cave_free(left);
	cave_free(gauntlet);
	cave_free(right);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}